

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QUrl,_unsigned_int> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QUrl,_unsigned_int>_>::findNode<QUrl>
          (Data<QHashPrivate::Node<QUrl,_unsigned_int>_> *this,QUrl *key)

{
  byte bVar1;
  Node<QUrl,_unsigned_int> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QUrl>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QUrl,_unsigned_int> *)0x0;
  }
  else {
    pNVar2 = (Node<QUrl,_unsigned_int> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }